

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O0

int lws_hdr_custom_length(lws *wsi,char *name,int nlen)

{
  uint16_t uVar1;
  int iVar2;
  uint local_28;
  ah_data_idx_t ll;
  int nlen_local;
  char *name_local;
  lws *wsi_local;
  
  if (((wsi->http).ah != (allocated_headers *)0x0) && ((*(ulong *)&wsi->field_0x46e >> 1 & 1) == 0))
  {
    for (local_28 = ((wsi->http).ah)->unk_ll_head; local_28 != 0;
        local_28 = lws_ser_ru32be((uint8_t *)(((wsi->http).ah)->data + (local_28 + 4)))) {
      if (((wsi->http).ah)->data_length <= local_28) {
        return -1;
      }
      uVar1 = lws_ser_ru16be((uint8_t *)(((wsi->http).ah)->data + local_28));
      if ((nlen == (uint)uVar1) &&
         (iVar2 = strncmp(name,((wsi->http).ah)->data + (local_28 + 8),(ulong)(uint)nlen),
         iVar2 == 0)) {
        uVar1 = lws_ser_ru16be((uint8_t *)(((wsi->http).ah)->data + (local_28 + 2)));
        return (uint)uVar1;
      }
    }
  }
  return -1;
}

Assistant:

int
lws_hdr_custom_length(struct lws *wsi, const char *name, int nlen)
{
	ah_data_idx_t ll;

	if (!wsi->http.ah || wsi->mux_substream)
		return -1;

	ll = wsi->http.ah->unk_ll_head;
	while (ll) {
		if (ll >= wsi->http.ah->data_length)
			return -1;
		if (nlen == lws_ser_ru16be(
			(uint8_t *)&wsi->http.ah->data[ll + UHO_NLEN]) &&
		    !strncmp(name, &wsi->http.ah->data[ll + UHO_NAME], (unsigned int)nlen))
			return lws_ser_ru16be(
				(uint8_t *)&wsi->http.ah->data[ll + UHO_VLEN]);

		ll = lws_ser_ru32be((uint8_t *)&wsi->http.ah->data[ll + UHO_LL]);
	}

	return -1;
}